

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::traversal_algorithm::log_timeout
          (traversal_algorithm *this,observer_ptr *o,char *prefix)

{
  char cVar1;
  char cVar2;
  dht_observer *pdVar3;
  dht_observer *pdVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  node *this_00;
  element_type *peVar8;
  node_id *pnVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 extraout_var;
  dht_observer *pdVar12;
  address *addr;
  span<const_char> in;
  address local_b8;
  string local_98;
  aux *local_68;
  char *local_60;
  string local_58;
  dht_observer *local_38;
  dht_observer *logger;
  char *prefix_local;
  observer_ptr *o_local;
  traversal_algorithm *this_local;
  
  logger = (dht_observer *)prefix;
  prefix_local = (char *)o;
  o_local = (observer_ptr *)this;
  this_00 = get_node(this);
  local_38 = dht::node::observer(this_00);
  if ((local_38 != (dht_observer *)0x0) &&
     (uVar5 = (**(local_38->super_dht_logger)._vptr_dht_logger)(local_38,4), pdVar4 = logger,
     pdVar3 = local_38, (uVar5 & 1) != 0)) {
    uVar5 = this->m_id;
    pdVar12 = local_38;
    peVar8 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)prefix_local);
    pnVar9 = observer::id(peVar8);
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)&local_68,pnVar9);
    in.m_len = (difference_type)pdVar12;
    in.m_ptr = local_60;
    libtorrent::aux::to_hex_abi_cxx11_(&local_58,local_68,in);
    uVar10 = ::std::__cxx11::string::c_str();
    peVar8 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)prefix_local);
    pnVar9 = observer::id(peVar8);
    iVar6 = distance_exp(&this->m_target,pnVar9);
    peVar8 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)prefix_local);
    observer::target_addr(&local_b8,peVar8);
    libtorrent::aux::print_address_abi_cxx11_(&local_98,(aux *)&local_b8,addr);
    uVar11 = ::std::__cxx11::string::c_str();
    cVar1 = this->m_branch_factor;
    cVar2 = this->m_invoke_count;
    iVar7 = (*this->_vptr_traversal_algorithm[2])();
    (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
              (pdVar3,4,
               "[%u] %sTIMEOUT id: %s distance: %d addr: %s branch-factor: %d invoke-count: %d type: %s"
               ,(ulong)uVar5,pdVar4,uVar10,iVar6,uVar11,(int)cVar1,(int)cVar2,
               CONCAT44(extraout_var,iVar7));
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void traversal_algorithm::log_timeout(observer_ptr const& o, char const* prefix) const
{
	dht_observer * logger = get_node().observer();
	if (logger != nullptr && logger->should_log(dht_logger::traversal))
	{
		logger->log(dht_logger::traversal
			, "[%u] %sTIMEOUT id: %s distance: %d addr: %s branch-factor: %d "
			"invoke-count: %d type: %s"
			, m_id, prefix, aux::to_hex(o->id()).c_str(), distance_exp(m_target, o->id())
			, aux::print_address(o->target_addr()).c_str(), m_branch_factor
			, m_invoke_count, name());
	}

}